

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O1

bool __thiscall QDesktopUnixServices::openUrl(QDesktopUnixServices *this,QUrl *url)

{
  char cVar1;
  bool bVar2;
  undefined4 uVar3;
  QWindow *this_00;
  QPlatformNativeInterface *pQVar4;
  long *plVar5;
  QPlatformWindow *pQVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  anon_class_8_1_8991fb9c_for_openUrlInternal local_78;
  QUrl local_70;
  anon_class_8_1_8991fb9c_for_openUrlInternal local_68;
  QObject local_60 [8];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.this = this;
  QGuiApplication::platformName();
  QVar9.m_data = (char *)0x7;
  QVar9.m_size = (qsizetype)&local_58;
  cVar1 = QString::startsWith(QVar9,0x6912fe);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar1 == '\0') {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    bVar2 = QtPrivate::detail::
            StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:508:17),_void>
            ::anon_class_16_2_17300a76_for_o::anon_class_8_1_8991fb9c_for_openUrlInternal::
            operator()(&local_68,url,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_006306ac;
  }
  local_78.this = local_68.this;
  QUrl::QUrl(&local_70,url);
  this_00 = QGuiApplication::focusWindow();
  if (this_00 == (QWindow *)0x0) {
LAB_0063065f:
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    QtPrivate::detail::
    StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:508:17),_void>
    ::anon_class_16_2_17300a76_for_o::anon_class_8_1_8991fb9c_for_openUrlInternal::operator()
              (&local_78,&local_70,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar4 = QGuiApplication::platformNativeInterface();
    if (pQVar4 == (QPlatformNativeInterface *)0x0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(pQVar4,&QPlatformNativeInterface::typeinfo,
                                      &QNativeInterface::QWaylandApplication::typeinfo,
                                      0xfffffffffffffffe);
    }
    pQVar6 = QWindow::handle(this_00);
    if (pQVar6 == (QPlatformWindow *)0x0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)__dynamic_cast(pQVar6,&QPlatformWindow::typeinfo,
                                        &QNativeInterface::Private::QWaylandWindow::typeinfo,
                                        0xfffffffffffffffe);
    }
    if (ppvVar7 == (void **)0x0 || plVar5 == (long *)0x0) goto LAB_0063065f;
    local_58.d.d = (Data *)QNativeInterface::Private::QWaylandWindow::xdgActivationTokenCreated;
    local_58.d.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:508:17),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(QDesktopUnixServices **)(puVar8 + 4) = local_78.this;
    QUrl::QUrl((QUrl *)(puVar8 + 6),&local_70);
    QObject::connectImpl
              (local_60,ppvVar7,(QObject *)&local_58,ppvVar7,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar8,(int *)0x100,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    uVar3 = (**(code **)(*plVar5 + 0x40))(plVar5);
    (**(code **)((long)*ppvVar7 + 0x70))(ppvVar7,uVar3);
  }
  QUrl::~QUrl(&local_70);
  bVar2 = true;
LAB_006306ac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDesktopUnixServices::openUrl(const QUrl &url)
{
    auto openUrlInternal = [this](const QUrl &url, const QString &xdgActivationToken) {
        if (url.scheme() == "mailto"_L1) {
#  if QT_CONFIG(dbus)
            if (checkNeedPortalSupport()) {
                const QString parentWindow = QGuiApplication::focusWindow()
                        ? portalWindowIdentifier(QGuiApplication::focusWindow())
                        : QString();
                QDBusError error = xdgDesktopPortalSendEmail(url, parentWindow, xdgActivationToken);
                if (!error.isValid())
                    return true;

                // service not running, fall back
            }
#  endif
            return openDocument(url);
        }

#  if QT_CONFIG(dbus)
        if (checkNeedPortalSupport()) {
            const QString parentWindow = QGuiApplication::focusWindow()
                    ? portalWindowIdentifier(QGuiApplication::focusWindow())
                    : QString();
            QDBusError error = xdgDesktopPortalOpenUrl(url, parentWindow, xdgActivationToken);
            if (!error.isValid())
                return true;
        }
#  endif

        if (m_webBrowser.isEmpty()
            && !detectWebBrowser(desktopEnvironment(), true, &m_webBrowser)) {
            qCWarning(lcQpaServices, "Unable to detect a web browser to launch '%s'", qPrintable(url.toString()));
            return false;
        }
        return launch(m_webBrowser, url, xdgActivationToken);
    };

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        runWithXdgActivationToken(
                [openUrlInternal, url](const QString &token) { openUrlInternal(url, token); });

        return true;

    } else {
        return openUrlInternal(url, QString());
    }
}